

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3Vacuum(Parse *pParse,Token *pNm)

{
  int p1;
  Vdbe *p;
  Token *pTStack_28;
  
  p = sqlite3GetVdbe(pParse);
  if (pNm == (Token *)0x0) {
    p1 = 0;
  }
  else {
    p1 = sqlite3TwoPartName(pParse,pNm,pNm,&pTStack_28);
  }
  if ((p != (Vdbe *)0x0) && (1 < p1 || p1 == 0)) {
    sqlite3VdbeAddOp1(p,10,p1);
    sqlite3VdbeUsesBtree(p,p1);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Vacuum(Parse *pParse, Token *pNm){
  Vdbe *v = sqlite3GetVdbe(pParse);
  int iDb = pNm ? sqlite3TwoPartName(pParse, pNm, pNm, &pNm) : 0;
  if( v && (iDb>=2 || iDb==0) ){
    sqlite3VdbeAddOp1(v, OP_Vacuum, iDb);
    sqlite3VdbeUsesBtree(v, iDb);
  }
  return;
}